

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRefs.c
# Opt level: O3

int Abc_NodeDeref_rec(Abc_Obj_t *pNode)

{
  Abc_Obj_t *pNode_00;
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  
  uVar1 = *(uint *)&pNode->field_0x14 & 0xf;
  iVar4 = 0;
  if ((uVar1 != 2) && (iVar4 = 0, uVar1 != 5)) {
    iVar2 = (pNode->vFanins).nSize;
    iVar4 = 1;
    if (0 < iVar2) {
      lVar5 = 0;
      do {
        pNode_00 = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar5]];
        iVar3 = (pNode_00->vFanouts).nSize;
        if (iVar3 < 1) {
          __assert_fail("pFanin->vFanouts.nSize > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcRefs.c"
                        ,0xdf,"int Abc_NodeDeref_rec(Abc_Obj_t *)");
        }
        iVar3 = iVar3 + -1;
        (pNode_00->vFanouts).nSize = iVar3;
        if (iVar3 == 0) {
          iVar2 = Abc_NodeDeref_rec(pNode_00);
          iVar4 = iVar4 + iVar2;
          iVar2 = (pNode->vFanins).nSize;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < iVar2);
    }
  }
  return iVar4;
}

Assistant:

int Abc_NodeDeref_rec( Abc_Obj_t * pNode )
{
    Abc_Obj_t * pFanin;
    int i, Counter = 1;
    if ( Abc_ObjIsCi(pNode) )
        return 0;
    Abc_ObjForEachFanin( pNode, pFanin, i )
    {
        assert( pFanin->vFanouts.nSize > 0 );
        if ( --pFanin->vFanouts.nSize == 0 )
            Counter += Abc_NodeDeref_rec( pFanin );
    }
    return Counter;
}